

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder.c
# Opt level: O2

lzma_ret lzma_lzma_encoder_reset(lzma_coder_conflict9 *coder,lzma_options_lzma *options)

{
  byte bVar1;
  _Bool _Var2;
  uint32_t bt_i_1;
  lzma_ret lVar3;
  long lVar4;
  probability (*papVar5) [768];
  probability (*papVar6) [64];
  uint uVar7;
  probability (*papVar8) [16];
  uint32_t bt_i;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  
  _Var2 = is_options_valid(options);
  if (_Var2) {
    coder->pos_mask = ~(-1 << ((byte)options->pb & 0x1f));
    coder->literal_context_bits = options->lc;
    coder->literal_pos_mask = ~(-1 << ((byte)options->lp & 0x1f));
    (coder->rc).low = 0;
    (coder->rc).cache_size = 1;
    (coder->rc).range = 0xffffffff;
    (coder->rc).cache = '\0';
    (coder->rc).count = 0;
    (coder->rc).pos = 0;
    coder->state = STATE_LIT_LIT;
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      coder->reps[lVar4] = 0;
    }
    uVar7 = options->lp + options->lc;
    if (4 < uVar7) {
      __assert_fail("lc + lp <= LZMA_LCLP_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_common.h"
                    ,0x87,"void literal_init(probability (*)[768], uint32_t, uint32_t)");
    }
    papVar5 = coder->literal;
    for (uVar9 = 0; bVar1 = (byte)uVar7 & 0x1f, uVar9 >> bVar1 == 0; uVar9 = uVar9 + 1) {
      for (uVar10 = (ulong)(0 >> bVar1); uVar10 != 0x300; uVar10 = uVar10 + 1) {
        (*papVar5)[uVar10] = 0x400;
      }
      papVar5 = papVar5 + 1;
    }
    uVar7 = coder->pos_mask;
    papVar8 = coder->is_rep0_long;
    for (lVar4 = 0; lVar4 != 0xc; lVar4 = lVar4 + 1) {
      for (lVar11 = 0; (ulong)uVar7 + 1 != lVar11; lVar11 = lVar11 + 1) {
        papVar8[-0xf][lVar11] = 0x400;
        (*papVar8)[lVar11] = 0x400;
      }
      coder->is_rep[lVar4] = 0x400;
      coder->is_rep0[lVar4] = 0x400;
      coder->is_rep1[lVar4] = 0x400;
      coder->is_rep2[lVar4] = 0x400;
      papVar8 = papVar8 + 1;
    }
    for (lVar4 = 0; lVar4 != 0x72; lVar4 = lVar4 + 1) {
      coder->pos_special[lVar4] = 0x400;
    }
    papVar6 = coder->pos_slot;
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      for (lVar11 = 0; lVar11 != 0x40; lVar11 = lVar11 + 1) {
        (*papVar6)[lVar11] = 0x400;
      }
      papVar6 = papVar6 + 1;
    }
    for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
      coder->pos_align[lVar4] = 0x400;
    }
    length_encoder_reset(&coder->match_len_encoder,1 << ((byte)options->pb & 0x1f),coder->fast_mode)
    ;
    length_encoder_reset(&coder->rep_len_encoder,1 << ((byte)options->pb & 0x1f),coder->fast_mode);
    coder->match_price_count = 0x7fffffff;
    coder->align_price_count = 0x7fffffff;
    coder->opts_end_index = 0;
    coder->opts_current_index = 0;
    lVar3 = LZMA_OK;
  }
  else {
    lVar3 = LZMA_OPTIONS_ERROR;
  }
  return lVar3;
}

Assistant:

extern lzma_ret
lzma_lzma_encoder_reset(lzma_coder *coder, const lzma_options_lzma *options)
{
	size_t i, j;

	if (!is_options_valid(options))
		return LZMA_OPTIONS_ERROR;

	coder->pos_mask = (1U << options->pb) - 1;
	coder->literal_context_bits = options->lc;
	coder->literal_pos_mask = (1U << options->lp) - 1;

	// Range coder
	rc_reset(&coder->rc);

	// State
	coder->state = STATE_LIT_LIT;
	for (i = 0; i < REP_DISTANCES; ++i)
		coder->reps[i] = 0;

	literal_init(coder->literal, options->lc, options->lp);

	// Bit encoders
	for (i = 0; i < STATES; ++i) {
		for (j = 0; j <= coder->pos_mask; ++j) {
			bit_reset(coder->is_match[i][j]);
			bit_reset(coder->is_rep0_long[i][j]);
		}

		bit_reset(coder->is_rep[i]);
		bit_reset(coder->is_rep0[i]);
		bit_reset(coder->is_rep1[i]);
		bit_reset(coder->is_rep2[i]);
	}

	for (i = 0; i < FULL_DISTANCES - END_POS_MODEL_INDEX; ++i)
		bit_reset(coder->pos_special[i]);

	// Bit tree encoders
	for (i = 0; i < LEN_TO_POS_STATES; ++i)
		bittree_reset(coder->pos_slot[i], POS_SLOT_BITS);

	bittree_reset(coder->pos_align, ALIGN_BITS);

	// Length encoders
	length_encoder_reset(&coder->match_len_encoder,
			1U << options->pb, coder->fast_mode);

	length_encoder_reset(&coder->rep_len_encoder,
			1U << options->pb, coder->fast_mode);

	// Price counts are incremented every time appropriate probabilities
	// are changed. price counts are set to zero when the price tables
	// are updated, which is done when the appropriate price counts have
	// big enough value, and lzma_mf.read_ahead == 0 which happens at
	// least every OPTS (a few thousand) possible price count increments.
	//
	// By resetting price counts to UINT32_MAX / 2, we make sure that the
	// price tables will be initialized before they will be used (since
	// the value is definitely big enough), and that it is OK to increment
	// price counts without risk of integer overflow (since UINT32_MAX / 2
	// is small enough). The current code doesn't increment price counts
	// before initializing price tables, but it maybe done in future if
	// we add support for saving the state between LZMA2 chunks.
	coder->match_price_count = UINT32_MAX / 2;
	coder->align_price_count = UINT32_MAX / 2;

	coder->opts_end_index = 0;
	coder->opts_current_index = 0;

	return LZMA_OK;
}